

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font.cpp
# Opt level: O0

void __thiscall dpfb::Font::readFontName(Font *this)

{
  bool bVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint16_t uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  char16_t cVar9;
  uint32_t uVar10;
  FontError *pFVar11;
  char16_t *begin;
  char16_t *pcVar12;
  size_type sVar13;
  ulong uVar14;
  uint16_t uVar15;
  unicode local_b0 [32];
  reference local_90;
  char16_t *ch;
  iterator __end2;
  iterator __begin2;
  vector<char16_t,_std::allocator<char16_t>_> *__range2;
  vector<char16_t,_std::allocator<char16_t>_> utf16Name;
  int64_t pos;
  string *dst;
  uint16_t strOffset;
  uint16_t strByteLen;
  uint16_t nameId;
  uint16_t languageId;
  uint16_t encodingId;
  uint16_t platformId;
  uint32_t storageOffset;
  uint16_t stringsOffset;
  uint16_t count;
  uint16_t format;
  uint32_t tableOffset;
  uint16_t encodingIdWinUcs2;
  uint16_t languageIdWinEnglishUs;
  uint16_t platformIdWin;
  Font *this_local;
  
  uVar10 = sfntTag('n','a','m','e');
  uVar10 = SfntOffsetTable::getTableOffset(&this->sfntOffsetTable,uVar10);
  if (uVar10 == 0) {
    pFVar11 = (FontError *)__cxa_allocate_exception(0x10);
    FontError::runtime_error(pFVar11,"Font has no \"name\" table");
    __cxa_throw(pFVar11,&FontError::typeinfo,FontError::~FontError);
  }
  streams::ConstMemStream::seek(&this->fontStream,(ulong)uVar10,set);
  uVar2 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
  if ((uVar2 != 0) && (uVar2 != 1)) {
    pFVar11 = (FontError *)__cxa_allocate_exception(0x10);
    FontError::runtime_error(pFVar11,"Invalid \"name\" table format");
    __cxa_throw(pFVar11,&FontError::typeinfo,FontError::~FontError);
  }
  storageOffset._0_2_ = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
  if ((uint16_t)storageOffset == 0) {
    pFVar11 = (FontError *)__cxa_allocate_exception(0x10);
    FontError::runtime_error(pFVar11,"\"name\" table has no records");
    __cxa_throw(pFVar11,&FontError::typeinfo,FontError::~FontError);
  }
  uVar2 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
LAB_00128d13:
  do {
    uVar15 = (uint16_t)storageOffset - 1;
    if ((uint16_t)storageOffset == 0) {
LAB_00129022:
      uVar14 = std::__cxx11::string::empty();
      if ((uVar14 & 1) != 0) {
        std::__cxx11::string::operator=
                  ((string *)&this->fontName,(string *)&(this->fontName).groupFamily);
      }
      return;
    }
    uVar3 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
    uVar4 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
    uVar5 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
    uVar6 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
    uVar7 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
    uVar8 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
    storageOffset._0_2_ = uVar15;
  } while ((uVar3 < 3) || (uVar5 < 0x409));
  if ((3 < uVar3) || (((1 < uVar4 || (0x409 < uVar5)) || (0x11 < uVar6)))) goto LAB_00129022;
  switch(uVar6) {
  case 1:
    pos = (int64_t)&(this->fontName).groupFamily;
    break;
  case 2:
    pos = (int64_t)&(this->fontName).style;
    break;
  default:
    goto LAB_00128d13;
  case 0x10:
    pos = (int64_t)&this->fontName;
    break;
  case 0x11:
    pos = (int64_t)&(this->fontName).style;
  }
  utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)streams::ConstMemStream::getPosition(&this->fontStream);
  streams::ConstMemStream::seek(&this->fontStream,(ulong)(uVar10 + uVar2 + (uint)uVar8),set);
  std::vector<char16_t,_std::allocator<char16_t>_>::vector
            ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2);
  std::vector<char16_t,_std::allocator<char16_t>_>::resize
            ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2,(ulong)(uVar7 >> 1));
  __end2 = std::vector<char16_t,_std::allocator<char16_t>_>::begin
                     ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2);
  ch = (char16_t *)
       std::vector<char16_t,_std::allocator<char16_t>_>::end
                 ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>
                                     *)&ch), bVar1) {
    local_90 = __gnu_cxx::
               __normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>::
               operator*(&__end2);
    cVar9 = streams::Stream::readU16Be(&(this->fontStream).super_Stream);
    *local_90 = cVar9;
    __gnu_cxx::__normal_iterator<char16_t_*,_std::vector<char16_t,_std::allocator<char16_t>_>_>::
    operator++(&__end2);
  }
  begin = std::vector<char16_t,_std::allocator<char16_t>_>::data
                    ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2);
  pcVar12 = std::vector<char16_t,_std::allocator<char16_t>_>::data
                      ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2);
  sVar13 = std::vector<char16_t,_std::allocator<char16_t>_>::size
                     ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2);
  unicode::utf16ToUtf8_abi_cxx11_(local_b0,begin,pcVar12 + sVar13);
  std::__cxx11::string::operator=((string *)pos,(string *)local_b0);
  std::__cxx11::string::~string((string *)local_b0);
  streams::ConstMemStream::seek
            (&this->fontStream,
             (int64_t)utf16Name.super__Vector_base<char16_t,_std::allocator<char16_t>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,set);
  std::vector<char16_t,_std::allocator<char16_t>_>::~vector
            ((vector<char16_t,_std::allocator<char16_t>_> *)&__range2);
  goto LAB_00128d13;
}

Assistant:

void Font::readFontName()
{
    const std::uint16_t platformIdWin = 3;
    const std::uint16_t languageIdWinEnglishUs = 0x0409;
    const std::uint16_t encodingIdWinUcs2 = 1;

    const auto tableOffset = sfntOffsetTable.getTableOffset(
        sfntTag('n', 'a', 'm', 'e'));
    if (tableOffset == 0)
        // "name" is a required table.
        throw FontError("Font has no \"name\" table");

    fontStream.seek(tableOffset, SeekOrigin::set);

    const auto format = fontStream.readU16Be();
    if (format != 0 && format != 1)
        throw FontError("Invalid \"name\" table format");

    auto count = fontStream.readU16Be();
    if (count == 0)
        throw FontError("\"name\" table has no records");

    const auto stringsOffset = fontStream.readU16Be();
    const auto storageOffset = tableOffset + stringsOffset;

    while (count--) {
        const auto platformId = fontStream.readU16Be();
        const auto encodingId = fontStream.readU16Be();
        const auto languageId = fontStream.readU16Be();
        const auto nameId = fontStream.readU16Be();
        const auto strByteLen = fontStream.readU16Be();
        const auto strOffset = fontStream.readU16Be();

        // We rely on the fact that name records are sorted.
        if (platformId < platformIdWin
                || languageId < languageIdWinEnglishUs)
            continue;
        else if (platformId > platformIdWin
                || encodingId > encodingIdWinUcs2
                || languageId > languageIdWinEnglishUs)
            break;

        if (nameId > 17)
            break;

        std::string* dst;
        switch (nameId) {
            case 1:
                dst = &fontName.groupFamily;
                break;
            case 2:
                dst = &fontName.style;
                break;
            case 16:  // Typographic Family
                dst = &fontName.family;
                break;
            case 17:  // Typographic Subfamily
                dst = &fontName.style;
                break;
            default:
                continue;
                break;
        }

        const auto pos = fontStream.getPosition();
        fontStream.seek(storageOffset + strOffset, SeekOrigin::set);

        std::vector<char16_t> utf16Name;
        utf16Name.resize(strByteLen / 2);
        for (auto& ch : utf16Name)
            ch = fontStream.readU16Be();

        *dst = unicode::utf16ToUtf8(
            utf16Name.data(), utf16Name.data() + utf16Name.size());

        fontStream.seek(pos, SeekOrigin::set);
    }

    // Fallback from id 16 to id 1. No need to do the same for
    // fontName.style (from id 17 to id 2) as it's done naturally
    // by ids order.
    if (fontName.family.empty())
        fontName.family = fontName.groupFamily;
}